

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O2

void __thiscall QTextCursor::insertHtml(QTextCursor *this,QString *html)

{
  QTextCursorPrivate *pQVar1;
  long in_FS_OFFSET;
  QTextDocumentFragment fragment;
  QTextDocumentFragment local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->d).d.ptr != (QTextCursorPrivate *)0x0) {
    pQVar1 = QSharedDataPointer<QTextCursorPrivate>::operator->(&this->d);
    if (pQVar1->priv != (QTextDocumentPrivate *)0x0) {
      local_28.d = (QTextDocumentFragmentPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar1 = QSharedDataPointer<QTextCursorPrivate>::operator->(&this->d);
      QTextDocumentFragment::fromHtml(&local_28,html,*(QTextDocument **)&pQVar1->priv->field_0x8);
      insertFragment(this,&local_28);
      QTextDocumentFragment::~QTextDocumentFragment(&local_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextCursor::insertHtml(const QString &html)
{
    if (!d || !d->priv)
        return;
    QTextDocumentFragment fragment = QTextDocumentFragment::fromHtml(html, d->priv->document());
    insertFragment(fragment);
}